

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_string_utf8_index_ref(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp i)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  ulong in_R8;
  sexp off;
  sexp in_stack_00000038;
  char *in_stack_00000040;
  sexp in_stack_00000048;
  sexp in_stack_00000050;
  sexp in_stack_fffffffffffffff8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
    if ((in_R8 & 1) == 1) {
      psVar2 = sexp_string_index_to_cursor((sexp)n,str,(sexp_sint_t)i,off,in_stack_fffffffffffffff8)
      ;
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
        auVar1._8_8_ = (long)psVar2 >> 0x3f;
        auVar1._0_8_ = (ulong)psVar2 & 0xfffffffffffffffd;
        if (SUB168(auVar1 / SEXT816(8),0) < (in_RCX->value).uvector.length) {
          psVar2 = sexp_string_utf8_ref(in_RSI,in_RDX,in_RCX);
        }
        else {
          psVar2 = sexp_user_exception(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                                       in_stack_00000038);
        }
      }
    }
    else {
      psVar2 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
    }
  }
  else {
    psVar2 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
  }
  return psVar2;
}

Assistant:

sexp sexp_string_utf8_index_ref (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp i) {
  sexp off;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, i);
  off = sexp_string_index_to_cursor(ctx, self, n, str, i);
  if (sexp_exceptionp(off)) return off;
  if (sexp_unbox_string_cursor(off) >= (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-ref: index out of range", i);
  return sexp_string_utf8_ref(ctx, str, off);
}